

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool EvalChecksig(valtype *sig,valtype *pubkey,const_iterator pbegincodehash,const_iterator pend,
                 ScriptExecutionData *execdata,uint flags,BaseSignatureChecker *checker,
                 SigVersion sigversion,ScriptError *serror,bool *success)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  int iVar8;
  CScript *b;
  long in_FS_OFFSET;
  ScriptError SVar9;
  SigVersion local_7c;
  undefined1 local_78 [32];
  CScript scriptCode;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (WITNESS_V0 < sigversion) {
    if (sigversion != TAPSCRIPT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                    ,0x193,
                    "bool EvalChecksig(const valtype &, const valtype &, CScript::const_iterator, CScript::const_iterator, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                   );
    }
    puVar2 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    *success = puVar2 != puVar3;
    if (puVar2 == puVar3) {
LAB_003950ef:
      puVar5 = (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (pubkey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)puVar6 - (long)puVar5 == 0x20) {
        if ((puVar2 == puVar3) ||
           (iVar8 = (*checker->_vptr_BaseSignatureChecker[1])
                              (checker,puVar2,(long)puVar3 - (long)puVar2,puVar5,0x20,3,execdata,
                               serror), (char)iVar8 != '\0')) {
LAB_0039513e:
          bVar7 = true;
          goto LAB_00395151;
        }
      }
      else if (puVar6 == puVar5) {
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_PUBKEYTYPE;
        }
      }
      else {
        if ((flags >> 0x14 & 1) == 0) goto LAB_0039513e;
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_DISCOURAGE_UPGRADABLE_PUBKEYTYPE;
        }
      }
    }
    else {
      if (execdata->m_validation_weight_left_init == false) {
        __assert_fail("execdata.m_validation_weight_left_init",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                      ,0x168,
                      "bool EvalChecksigTapscript(const valtype &, const valtype &, ScriptExecutionData &, unsigned int, const BaseSignatureChecker &, SigVersion, ScriptError *, bool &)"
                     );
      }
      lVar4 = execdata->m_validation_weight_left;
      execdata->m_validation_weight_left = lVar4 + -0x32;
      if (0x31 < lVar4) goto LAB_003950ef;
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_TAPSCRIPT_VALIDATION_WEIGHT;
      }
    }
    bVar7 = false;
    goto LAB_00395151;
  }
  local_7c = sigversion;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator>
            (&scriptCode.super_CScriptBase,pbegincodehash,pend);
  if (sigversion == BASE) {
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    b = CScript::operator<<((CScript *)local_78,sig);
    iVar8 = FindAndDelete(&scriptCode,b);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
    if (((flags >> 0x10 & 1) == 0) || (iVar8 < 1)) goto LAB_00394fb6;
    if (serror != (ScriptError *)0x0) {
      SVar9 = SCRIPT_ERR_SIG_FINDANDDELETE;
LAB_003950dd:
      *serror = SVar9;
    }
LAB_003950e1:
    bVar7 = false;
  }
  else {
LAB_00394fb6:
    bVar7 = CheckSignatureEncoding(sig,flags,serror);
    if ((!bVar7) || (bVar7 = CheckPubKeyEncoding(pubkey,flags,&local_7c,serror), !bVar7))
    goto LAB_003950e1;
    iVar8 = (**checker->_vptr_BaseSignatureChecker)
                      (checker,sig,pubkey,&scriptCode,(ulong)sigversion);
    *success = SUB41(iVar8,0);
    bVar7 = true;
    if (((flags >> 0xe & 1) != 0 && SUB41(iVar8,0) == false) &&
       ((sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (sig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start)) {
      if (serror != (ScriptError *)0x0) {
        SVar9 = SCRIPT_ERR_SIG_NULLFAIL;
        goto LAB_003950dd;
      }
      goto LAB_003950e1;
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptCode.super_CScriptBase);
LAB_00395151:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

static bool EvalChecksig(const valtype& sig, const valtype& pubkey, CScript::const_iterator pbegincodehash, CScript::const_iterator pend, ScriptExecutionData& execdata, unsigned int flags, const BaseSignatureChecker& checker, SigVersion sigversion, ScriptError* serror, bool& success)
{
    switch (sigversion) {
    case SigVersion::BASE:
    case SigVersion::WITNESS_V0:
        return EvalChecksigPreTapscript(sig, pubkey, pbegincodehash, pend, flags, checker, sigversion, serror, success);
    case SigVersion::TAPSCRIPT:
        return EvalChecksigTapscript(sig, pubkey, execdata, flags, checker, sigversion, serror, success);
    case SigVersion::TAPROOT:
        // Key path spending in Taproot has no script, so this is unreachable.
        break;
    }
    assert(false);
}